

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

void __thiscall
flatbuffers::TypedFloatConstantGenerator::TypedFloatConstantGenerator
          (TypedFloatConstantGenerator *this,char *double_prefix,char *single_prefix,
          char *nan_number,char *pos_inf_number,char *neg_inf_number)

{
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  (this->super_FloatConstantGenerator)._vptr_FloatConstantGenerator =
       (_func_int **)&PTR__TypedFloatConstantGenerator_002fbcb0;
  local_38 = &this->double_prefix_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,double_prefix,&local_39);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->single_prefix_,single_prefix,&local_3a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->nan_number_,nan_number,&local_3b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->pos_inf_number_,pos_inf_number,&local_3c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->neg_inf_number_,neg_inf_number,&local_3d);
  return;
}

Assistant:

TypedFloatConstantGenerator::TypedFloatConstantGenerator(
    const char *double_prefix, const char *single_prefix,
    const char *nan_number, const char *pos_inf_number,
    const char *neg_inf_number)
    : double_prefix_(double_prefix),
      single_prefix_(single_prefix),
      nan_number_(nan_number),
      pos_inf_number_(pos_inf_number),
      neg_inf_number_(neg_inf_number) {}